

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int evutil_read_file_(char *filename,char **content_out,size_t *len_out,int is_binary)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ssize_t sVar4;
  undefined8 uVar5;
  uint uVar6;
  size_t sVar7;
  stat st;
  
  if (content_out == (char **)0x0) {
    pcVar3 = "content_out";
    uVar5 = 0x96;
  }
  else {
    if (len_out != (size_t *)0x0) {
      *content_out = (char *)0x0;
      *len_out = 0;
      iVar1 = evutil_open_closeonexec_(filename,0,0);
      if (iVar1 < 0) {
        iVar1 = -1;
      }
      else {
        iVar2 = fstat(iVar1,(stat *)&st);
        if (((ulong)st.st_size < 0x7fffffffffffffff && iVar2 == 0) &&
           (pcVar3 = (char *)event_mm_malloc_(st.st_size + 1), pcVar3 != (char *)0x0)) {
          sVar7 = 0;
          do {
            sVar4 = read(iVar1,pcVar3 + sVar7,st.st_size - sVar7);
            uVar6 = (uint)sVar4;
            if ((int)uVar6 < 1) break;
            sVar7 = sVar7 + (uVar6 & 0x7fffffff);
          } while (sVar7 < (ulong)st.st_size);
          close(iVar1);
          if (-1 < (int)uVar6) {
            pcVar3[sVar7] = '\0';
            *len_out = sVar7;
            *content_out = pcVar3;
            return 0;
          }
          event_mm_free_(pcVar3);
        }
        else {
          close(iVar1);
        }
        iVar1 = -2;
      }
      return iVar1;
    }
    pcVar3 = "len_out";
    uVar5 = 0x97;
  }
  event_errx(-0x21522153,"%s:%d: Assertion %s failed in %s",
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/libevent/repo/evutil.c"
             ,uVar5,pcVar3,"evutil_read_file_");
}

Assistant:

int
evutil_read_file_(const char *filename, char **content_out, size_t *len_out,
    int is_binary)
{
	int fd, r;
	struct stat st;
	char *mem;
	size_t read_so_far=0;
	int mode = O_RDONLY;

	EVUTIL_ASSERT(content_out);
	EVUTIL_ASSERT(len_out);
	*content_out = NULL;
	*len_out = 0;

#ifdef O_BINARY
	if (is_binary)
		mode |= O_BINARY;
#endif

	fd = evutil_open_closeonexec_(filename, mode, 0);
	if (fd < 0)
		return -1;
	if (fstat(fd, &st) || st.st_size < 0 ||
	    st.st_size > EV_SSIZE_MAX-1 ) {
		close(fd);
		return -2;
	}
	mem = mm_malloc((size_t)st.st_size + 1);
	if (!mem) {
		close(fd);
		return -2;
	}
	read_so_far = 0;
#ifdef _WIN32
#define N_TO_READ(x) ((x) > INT_MAX) ? INT_MAX : ((int)(x))
#else
#define N_TO_READ(x) (x)
#endif
	while ((r = read(fd, mem+read_so_far, N_TO_READ(st.st_size - read_so_far))) > 0) {
		read_so_far += r;
		if (read_so_far >= (size_t)st.st_size)
			break;
		EVUTIL_ASSERT(read_so_far < (size_t)st.st_size);
	}
	close(fd);
	if (r < 0) {
		mm_free(mem);
		return -2;
	}
	mem[read_so_far] = 0;

	*len_out = read_so_far;
	*content_out = mem;
	return 0;
}